

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall
QColumnView::currentChanged(QColumnView *this,QModelIndex *current,QModelIndex *previous)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QColumnViewPrivate *current_00;
  qsizetype qVar4;
  QAbstractItemModel *pQVar5;
  ulong uVar6;
  QAbstractItemView *in_RDX;
  QModelIndex *in_RSI;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  bool found;
  int i;
  QColumnViewPrivate *d;
  bool in_stack_00000097;
  QModelIndex currentParent;
  QModelIndex *in_stack_ffffffffffffff48;
  QModelIndex *in_stack_ffffffffffffff50;
  byte local_a1;
  int local_94;
  uint in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QColumnViewPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  current_00 = d_func((QColumnView *)0x86579a);
  bVar2 = QModelIndex::isValid(in_stack_ffffffffffffff50);
  if (bVar2) {
    QModelIndex::parent((QModelIndex *)in_RDI);
    QModelIndex::parent((QModelIndex *)in_RDI);
    bVar2 = ::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_a1 = 0;
    if (bVar2) {
      pQVar5 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
      uVar3 = (**(code **)(*(long *)pQVar5 + 0x88))(pQVar5,in_RSI);
      local_a1 = 0;
      if ((uVar3 & 1) != 0) {
        pQVar5 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
        local_a1 = (**(code **)(*(long *)pQVar5 + 0x88))(pQVar5,in_RDX);
      }
    }
    if ((local_a1 & 1) != 0) {
      in_stack_ffffffffffffff74 = 0;
      while( true ) {
        in_stack_ffffffffffffff50 = (QModelIndex *)(long)in_stack_ffffffffffffff74;
        qVar4 = QList<QAbstractItemView_*>::size(&current_00->columns);
        if (qVar4 <= (long)in_stack_ffffffffffffff50) break;
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff50,
                   (qsizetype)in_stack_ffffffffffffff48);
        QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff50);
        bVar2 = ::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (bVar2) {
          qVar4 = QList<QAbstractItemView_*>::size(&current_00->columns);
          if (in_stack_ffffffffffffff74 + 1 < qVar4) {
            QAbstractItemView::currentChanged
                      (in_RDX,(QModelIndex *)current_00,
                       (QModelIndex *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
            ;
            goto LAB_00865a85;
          }
          break;
        }
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1;
      }
    }
    in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 & 0xffffff;
    bVar2 = ::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (bVar2) {
      local_94 = 0;
      while( true ) {
        in_stack_ffffffffffffff48 = (QModelIndex *)(long)local_94;
        qVar4 = QList<QAbstractItemView_*>::size(&current_00->columns);
        if (qVar4 <= (long)in_stack_ffffffffffffff48) break;
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff50,
                   (qsizetype)in_stack_ffffffffffffff48);
        QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff50);
        bVar2 = ::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (bVar2) {
          in_stack_ffffffffffffff70 = CONCAT13(1,(int3)in_stack_ffffffffffffff70);
          qVar4 = QList<QAbstractItemView_*>::size(&current_00->columns);
          if (qVar4 < local_94 + 2) {
            QColumnViewPrivate::createColumn
                      ((QColumnViewPrivate *)currentParent.i,(QModelIndex *)currentParent._0_8_,
                       in_stack_00000097);
          }
          break;
        }
        local_94 = local_94 + 1;
      }
    }
    if ((in_stack_ffffffffffffff70 & 0x1000000) == 0) {
      QColumnViewPrivate::closeColumns(this_00,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
    }
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
    uVar6 = (**(code **)(*(long *)pQVar5 + 0x88))(pQVar5,in_RSI);
    if ((uVar6 & 1) == 0) {
      updatePreviewWidget((QColumnView *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    QAbstractItemView::currentChanged
              (in_RDX,(QModelIndex *)current_00,
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    QAbstractItemView::currentChanged
              (in_RDX,(QModelIndex *)current_00,
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
LAB_00865a85:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QColumnView);
    if (!current.isValid()) {
        QAbstractItemView::currentChanged(current, previous);
        return;
    }

    QModelIndex currentParent = current.parent();
    // optimize for just moving up/down in a list where the child view doesn't change
    if (currentParent == previous.parent()
            && model()->hasChildren(current) && model()->hasChildren(previous)) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                if (d->columns.size() > i + 1) {
                    QAbstractItemView::currentChanged(current, previous);
                    return;
                }
                break;
            }
        }
    }

    // Scrolling to the right we need to have an empty spot
    bool found = false;
    if (currentParent == previous) {
        for (int i = 0; i < d->columns.size(); ++i) {
            if (currentParent == d->columns.at(i)->rootIndex()) {
                found = true;
                if (d->columns.size() < i + 2) {
                    d->createColumn(current, false);
                }
                break;
            }
        }
    }
    if (!found)
        d->closeColumns(current, true);

    if (!model()->hasChildren(current))
        emit updatePreviewWidget(current);

    QAbstractItemView::currentChanged(current, previous);
}